

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processQueryResponse(CoreBroker *this,ActionMessage *message)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type sVar4;
  reference pvVar5;
  __tuple_element_t<2UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *p_Var6;
  long in_RSI;
  long in_RDI;
  SmallBuffer *this_01;
  int ii;
  string str;
  __tuple_element_t<1UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *requesters;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *builder;
  JsonMapBuilder *in_stack_000001b0;
  CoreBroker *in_stack_000001b8;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *in_stack_fffffffffffffe88;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *p_Var7;
  undefined4 in_stack_fffffffffffffe90;
  undefined2 in_stack_fffffffffffffe94;
  unsigned_short in_stack_fffffffffffffe96;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb4;
  uint uVar8;
  allocator<char> *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  CoreBroker *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  int index;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  GlobalBrokerId id;
  int local_104;
  undefined1 local_99 [49];
  __tuple_element_t<1UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *local_68;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *local_60;
  allocator<char> local_41 [13];
  undefined8 in_stack_ffffffffffffffd0;
  JsonMapBuilder *in_stack_ffffffffffffffd8;
  
  if (*(short *)(in_RSI + 0x18) == 0) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xa10);
    join_0x00000010_0x00000000_ = SmallBuffer::to_string((SmallBuffer *)0x533841);
    index = (int)((ulong)in_RDI >> 0x20);
    val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (this_00,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),index,val);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffe96,
                        CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
    std::allocator<char>::~allocator(local_41);
  }
  else {
    bVar1 = isValidIndex<unsigned_short,std::vector<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>,std::allocator<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>>>>
                      (in_stack_fffffffffffffe96,in_stack_fffffffffffffe88);
    if (bVar1) {
      this_01 = (SmallBuffer *)(in_RDI + 0xaf8);
      std::
      vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
      ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                    *)this_01,(ulong)*(ushort *)(in_RSI + 0x18));
      local_60 = std::
                 get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                           ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             *)0x533954);
      std::
      vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
      ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                    *)this_01,(ulong)*(ushort *)(in_RSI + 0x18));
      local_68 = std::
                 get<1ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                           ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             *)0x53397c);
      p_Var7 = local_60;
      local_99._1_16_ = (undefined1  [16])SmallBuffer::to_string((SmallBuffer *)0x5339a2);
      __t = (basic_string_view<char,_std::char_traits<char>_> *)local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffed0,__t,(allocator<char> *)p_Var7);
      bVar1 = fileops::JsonMapBuilder::addComponent
                        (in_stack_ffffffffffffffd8,(string *)in_stack_ffffffffffffffd0,iVar3);
      uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeb4);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffe96,
                          CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
      std::allocator<char>::~allocator((allocator<char> *)local_99);
      if ((uVar8 & 0x1000000) != 0) {
        std::__cxx11::string::string(in_stack_fffffffffffffea0);
        uVar2 = (uint)*(ushort *)(in_RSI + 0x18);
        if (uVar2 == 8) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT26(in_stack_fffffffffffffe96,
                             CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)),
                    (char *)in_stack_fffffffffffffe88);
        }
        else if (uVar2 == 9) {
          generateGlobalStatus_abi_cxx11_(in_stack_000001b8,in_stack_000001b0);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffffee0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffe96,
                              CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
        }
        else {
          fileops::JsonMapBuilder::generate_abi_cxx11_((JsonMapBuilder *)this_01);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffffee0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffe96,
                              CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
        }
        local_104 = 0;
        while (iVar3 = local_104,
              sVar4 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                      size(local_68), iVar3 < (int)sVar4 + -1) {
          pvVar5 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                   operator[](local_68,(long)local_104);
          bVar1 = GlobalFederateId::operator==
                            (&pvVar5->dest_id,(GlobalBrokerId)*(BaseType *)(in_RDI + 0x14));
          if (bVar1) {
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                      (local_68,(long)local_104);
            gmlc::concurrency::
            DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::setDelayedValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (int)((ulong)in_RDI >> 0x20),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffee0);
          }
          else {
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                      (local_68,(long)local_104);
            SmallBuffer::operator=
                      (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(uVar8,uVar2));
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                      (local_68,(long)local_104);
            routeMessage((CoreBroker *)CONCAT44(uVar8,uVar2),
                         (ActionMessage *)CONCAT44(iVar3,in_stack_fffffffffffffea8));
          }
          local_104 = local_104 + 1;
        }
        pvVar5 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                           ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *
                            )CONCAT26(in_stack_fffffffffffffe96,
                                      CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
                           );
        id.gid = *(BaseType *)(in_RDI + 0x14);
        bVar1 = GlobalFederateId::operator==(&pvVar5->dest_id,id);
        if (bVar1) {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     CONCAT26(in_stack_fffffffffffffe96,
                              CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(id.gid,in_stack_fffffffffffffef0),
                            (int)((ulong)in_RDI >> 0x20),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffee0);
        }
        else {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     CONCAT26(in_stack_fffffffffffffe96,
                              CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
          SmallBuffer::operator=
                    (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(uVar8,uVar2));
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     CONCAT26(in_stack_fffffffffffffe96,
                              CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
          routeMessage((CoreBroker *)CONCAT44(uVar8,uVar2),
                       (ActionMessage *)CONCAT44(iVar3,in_stack_fffffffffffffea8));
        }
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x533ce0
                  );
        std::
        vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
        ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                      *)(in_RDI + 0xaf8),(ulong)*(ushort *)(in_RSI + 0x18));
        p_Var6 = std::
                 get<2ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                           ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             *)0x533d07);
        if (*p_Var6 == DISABLED) {
          fileops::JsonMapBuilder::reset
                    ((JsonMapBuilder *)
                     CONCAT26(in_stack_fffffffffffffe96,
                              CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
        }
        else {
          p_Var7 = local_60;
          iVar3 = generateMapObjectCounter(in_stack_fffffffffffffed0);
          in_stack_fffffffffffffe94 = (undefined2)iVar3;
          in_stack_fffffffffffffe96 = (unsigned_short)((uint)iVar3 >> 0x10);
          fileops::JsonMapBuilder::setCounterCode(p_Var7,iVar3);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffe96,
                            CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)));
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::processQueryResponse(const ActionMessage& message)
{
    if (message.counter == GENERAL_QUERY) {
        activeQueries.setDelayedValue(message.messageID, std::string(message.payload.to_string()));
        return;
    }
    if (isValidIndex(message.counter, mapBuilders)) {
        auto& builder = std::get<0>(mapBuilders[message.counter]);
        auto& requesters = std::get<1>(mapBuilders[message.counter]);
        if (builder.addComponent(std::string(message.payload.to_string()), message.messageID)) {
            std::string str;
            switch (message.counter) {
                case GLOBAL_STATUS:
                    str = generateGlobalStatus(builder);
                    break;
                case GLOBAL_FLUSH:
                    str = "{\"status\":true}";
                    break;
                default:
                    str = builder.generate();
                    break;
            }

            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(mapBuilders[message.counter]) == QueryReuse::DISABLED) {
                builder.reset();
            } else {
                builder.setCounterCode(generateMapObjectCounter());
            }
        }
    }
}